

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::emplaceRealloc<>
          (SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> *this,pointer pos)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  pointer p;
  size_type sVar4;
  Expression *pEVar5;
  Expression *pEVar6;
  pointer paVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  pointer pAVar11;
  pointer pAVar12;
  undefined4 uVar13;
  pointer pAVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  
  if (this->len == 0x333333333333333) {
    detail::throwLengthError();
  }
  uVar16 = this->len + 1;
  uVar3 = this->cap;
  if (uVar16 < uVar3 * 2) {
    uVar16 = uVar3 * 2;
  }
  if (0x333333333333333 - uVar3 < uVar3) {
    uVar16 = 0x333333333333333;
  }
  lVar17 = (long)pos - (long)this->data_;
  pAVar14 = (pointer)operator_new(uVar16 * 0x28);
  *(undefined8 *)((long)pAVar14 + lVar17) = 0;
  ((undefined8 *)((long)pAVar14 + lVar17))[1] = 0;
  puVar1 = (undefined8 *)((long)pAVar14 + lVar17 + 0x10);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined8 *)((long)pAVar14 + lVar17 + 0x20) = 0;
  p = this->data_;
  sVar4 = this->len;
  lVar15 = (long)p + (sVar4 * 0x28 - (long)pos);
  pAVar11 = p;
  pAVar12 = pAVar14;
  if (lVar15 == 0) {
    if (sVar4 != 0) {
      lVar15 = 0;
      do {
        *(undefined8 *)((long)&(pAVar14->edgeDescriptors)._M_extent._M_extent_value + lVar15) =
             *(undefined8 *)((long)&(p->edgeDescriptors)._M_extent._M_extent_value + lVar15);
        puVar1 = (undefined8 *)((long)&p->expr + lVar15);
        uVar8 = *puVar1;
        uVar9 = puVar1[1];
        puVar1 = (undefined8 *)((long)&p->edge + lVar15);
        uVar10 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pAVar14->edge + lVar15);
        *puVar2 = *puVar1;
        puVar2[1] = uVar10;
        puVar1 = (undefined8 *)((long)&pAVar14->expr + lVar15);
        *puVar1 = uVar8;
        puVar1[1] = uVar9;
        lVar15 = lVar15 + 0x28;
      } while (sVar4 * 0x28 != lVar15);
    }
  }
  else {
    for (; pAVar11 != pos; pAVar11 = pAVar11 + 1) {
      (pAVar12->edgeDescriptors)._M_extent._M_extent_value =
           (pAVar11->edgeDescriptors)._M_extent._M_extent_value;
      pEVar5 = pAVar11->expr;
      pEVar6 = pAVar11->condition;
      uVar13 = *(undefined4 *)&pAVar11->field_0x14;
      paVar7 = (pAVar11->edgeDescriptors)._M_ptr;
      pAVar12->edge = pAVar11->edge;
      *(undefined4 *)&pAVar12->field_0x14 = uVar13;
      (pAVar12->edgeDescriptors)._M_ptr = paVar7;
      pAVar12->expr = pEVar5;
      pAVar12->condition = pEVar6;
      pAVar12 = pAVar12 + 1;
    }
    memcpy((void *)((long)pAVar14 + lVar17 + 0x28),pos,((lVar15 - 0x28U) / 0x28) * 0x28 + 0x28);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar16;
  this->data_ = pAVar14;
  return (pointer)((long)pAVar14 + lVar17);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}